

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O1

uLong adler32(uLong adler,Bytef *buf,uInt len)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uLong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  
  uVar16 = adler & 0xffff;
  uVar2 = adler >> 0x10 & 0xffff;
  if (len == 1) {
    uVar14 = uVar16 + *buf;
    uVar16 = (uVar16 - 0xfff1) + (ulong)*buf;
    if (uVar14 < 0xfff1) {
      uVar16 = uVar14;
    }
    uVar4 = (uVar2 + uVar16) * 0x10000;
    uVar14 = uVar4 - 0xfff10000;
    if (uVar2 + uVar16 < 0xfff1) {
      uVar14 = uVar4;
    }
    uVar15 = uVar14 | uVar16;
  }
  else if (buf == (Bytef *)0x0) {
    uVar15 = 1;
  }
  else if (len < 0x10) {
    if (len != 0) {
      lVar5 = 0;
      do {
        uVar16 = uVar16 + buf[lVar5];
        uVar2 = uVar2 + uVar16;
        lVar5 = lVar5 + 1;
      } while (len != (uInt)lVar5);
    }
    uVar14 = uVar16 - 0xfff1;
    if (uVar16 < 0xfff1) {
      uVar14 = uVar16;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    iVar3 = SUB164(auVar1 * ZEXT816(0xf00e10d2fc5cd),8);
    uVar15 = ((int)uVar2 + (((uint)((int)uVar2 - iVar3) >> 1) + iVar3 >> 0xf) * -0xfff1) * 0x10000 |
             uVar14;
  }
  else {
    if (0x15af < len) {
      do {
        len = len - 0x15b0;
        lVar5 = 0;
        do {
          lVar6 = buf[lVar5] + uVar16;
          lVar17 = (ulong)buf[lVar5 + 1] + lVar6;
          lVar7 = (ulong)buf[lVar5 + 2] + lVar17;
          lVar18 = (ulong)buf[lVar5 + 3] + lVar7;
          lVar8 = (ulong)buf[lVar5 + 4] + lVar18;
          lVar19 = (ulong)buf[lVar5 + 5] + lVar8;
          lVar9 = (ulong)buf[lVar5 + 6] + lVar19;
          lVar20 = (ulong)buf[lVar5 + 7] + lVar9;
          lVar10 = (ulong)buf[lVar5 + 8] + lVar20;
          lVar21 = (ulong)buf[lVar5 + 9] + lVar10;
          lVar11 = (ulong)buf[lVar5 + 10] + lVar21;
          lVar22 = (ulong)buf[lVar5 + 0xb] + lVar11;
          lVar12 = (ulong)buf[lVar5 + 0xc] + lVar22;
          lVar23 = (ulong)buf[lVar5 + 0xd] + lVar12;
          lVar13 = (ulong)buf[lVar5 + 0xe] + lVar23;
          uVar16 = (ulong)buf[lVar5 + 0xf] + lVar13;
          uVar2 = uVar2 + lVar6 + lVar17 + lVar7 + lVar18 + lVar8 + lVar19 + lVar9 + lVar20 + lVar10
                  + lVar21 + lVar11 + lVar22 + lVar12 + lVar23 + lVar13 + uVar16;
          lVar5 = lVar5 + 0x10;
        } while ((int)lVar5 != 0x15b0);
        buf = buf + 0x15b0;
        uVar16 = uVar16 % 0xfff1;
        uVar2 = uVar2 % 0xfff1;
      } while (0x15af < len);
    }
    if (len != 0) {
      for (; 0xf < len; len = len - 0x10) {
        lVar5 = *buf + uVar16;
        lVar13 = (ulong)buf[1] + lVar5;
        lVar6 = (ulong)buf[2] + lVar13;
        lVar17 = (ulong)buf[3] + lVar6;
        lVar7 = (ulong)buf[4] + lVar17;
        lVar18 = (ulong)buf[5] + lVar7;
        lVar8 = (ulong)buf[6] + lVar18;
        lVar19 = (ulong)buf[7] + lVar8;
        lVar9 = (ulong)buf[8] + lVar19;
        lVar20 = (ulong)buf[9] + lVar9;
        lVar10 = (ulong)buf[10] + lVar20;
        lVar21 = (ulong)buf[0xb] + lVar10;
        lVar11 = (ulong)buf[0xc] + lVar21;
        lVar22 = (ulong)buf[0xd] + lVar11;
        lVar12 = (ulong)buf[0xe] + lVar22;
        uVar16 = (ulong)buf[0xf] + lVar12;
        uVar2 = uVar2 + lVar5 + lVar13 + lVar6 + lVar17 + lVar7 + lVar18 + lVar8 + lVar19 + lVar9 +
                lVar20 + lVar10 + lVar21 + lVar11 + lVar22 + lVar12 + uVar16;
        buf = buf + 0x10;
      }
      if (len != 0) {
        lVar5 = 0;
        do {
          uVar16 = uVar16 + buf[lVar5];
          uVar2 = uVar2 + uVar16;
          lVar5 = lVar5 + 1;
        } while (len != (uint)lVar5);
      }
      uVar16 = uVar16 % 0xfff1;
      uVar2 = uVar2 % 0xfff1;
    }
    uVar15 = uVar2 << 0x10 | uVar16;
  }
  return uVar15;
}

Assistant:

uLong ZEXPORT adler32(adler, buf, len)
    uLong adler;
    const Bytef *buf;
    uInt len;
{
    unsigned long sum2;
    unsigned n;

    /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (len == 1) {
        adler += buf[0];
        if (adler >= BASE)
            adler -= BASE;
        sum2 += adler;
        if (sum2 >= BASE)
            sum2 -= BASE;
        return adler | (sum2 << 16);
    }

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (buf == Z_NULL)
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (len < 16) {
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        if (adler >= BASE)
            adler -= BASE;
        MOD28(sum2);            /* only added so many BASE's */
        return adler | (sum2 << 16);
    }

    /* do length NMAX blocks -- requires just one modulo operation */
    while (len >= NMAX) {
        len -= NMAX;
        n = NMAX / 16;          /* NMAX is divisible by 16 */
        do {
            DO16(buf);          /* 16 sums unrolled */
            buf += 16;
        } while (--n);
        MOD(adler);
        MOD(sum2);
    }

    /* do remaining bytes (less than NMAX, still just one modulo) */
    if (len) {                  /* avoid modulos if none remaining */
        while (len >= 16) {
            len -= 16;
            DO16(buf);
            buf += 16;
        }
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        MOD(adler);
        MOD(sum2);
    }

    /* return recombined sums */
    return adler | (sum2 << 16);
}